

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-home-notice.c
# Opt level: O2

void borg_notice_home(borg_item_conflict *in_item,_Bool no_items)

{
  bitflag *flags;
  short sVar1;
  short sVar2;
  short sVar3;
  player_race *ppVar4;
  _Bool _Var5;
  byte bVar6;
  ushort uVar7;
  wchar_t wVar8;
  short sVar9;
  ushort uVar10;
  int16_t *piVar11;
  borg_item *item;
  long lVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  bitflag local_45 [5];
  long local_40;
  borg_shop *local_38;
  
  num_food = 0;
  num_fuel = 0;
  num_mold = 0;
  num_ident = 0;
  num_recall = 0;
  num_phase = 0;
  num_escape = 0;
  num_tele_staves = 0;
  num_teleport = 0;
  num_teleport_level = 0;
  num_recharge = 0;
  num_artifact = 0;
  num_ego = 0;
  num_invisible = 0;
  num_pfe = 0;
  num_glyph = 0;
  num_genocide = 0;
  num_mass_genocide = 0;
  num_berserk = 0;
  num_pot_rheat = 0;
  num_pot_rcold = 0;
  num_slow_digest = 0;
  num_regenerate = 0;
  num_telepathy = 0;
  num_see_inv = 0;
  num_ffall = 0;
  num_free_act = 0;
  num_hold_life = 0;
  num_immune_acid = 0;
  num_immune_elec = 0;
  num_immune_fire = 0;
  num_immune_cold = 0;
  num_resist_acid = 0;
  num_resist_elec = 0;
  num_resist_fire = 0;
  num_resist_cold = 0;
  num_resist_pois = 0;
  num_resist_conf = 0;
  num_resist_sound = 0;
  num_resist_LIGHT = 0;
  num_resist_dark = 0;
  num_resist_chaos = 0;
  num_resist_disen = 0;
  num_resist_shard = 0;
  num_resist_nexus = 0;
  num_resist_blind = 0;
  num_resist_neth = 0;
  num_sustain_str = 0;
  num_sustain_int = 0;
  num_sustain_wis = 0;
  num_sustain_dex = 0;
  num_sustain_con = 0;
  num_sustain_all = 0;
  home_stat_add[4] = 0;
  home_stat_add[0] = 0;
  home_stat_add[1] = 0;
  home_stat_add[2] = 0;
  home_stat_add[3] = 0;
  num_weapons = 0;
  num_bow = 0;
  num_rings = 0;
  num_neck = 0;
  num_armor = 0;
  num_cloaks = 0;
  num_shields = 0;
  num_hats = 0;
  num_gloves = 0;
  num_boots = 0;
  num_LIGHT = 0;
  num_speed = 0;
  num_edged_weapon = 0;
  num_bad_gloves = 0;
  num_cure_critical = 0;
  num_cure_serious = 0;
  num_fix_exp = 0;
  num_mana = 0;
  num_heal = 0;
  num_ezheal = 0;
  num_life = 0;
  if (in_item == (borg_item_conflict *)0x0 && !no_items) {
    num_ezheal_true = 0;
    num_heal_true = 0;
    num_life_true = 0;
  }
  num_missile = 0;
  num_book[8] = 0;
  num_fix_stat[0] = 0;
  num_fix_stat[1] = 0;
  num_fix_stat[2] = 0;
  num_fix_stat[3] = 0;
  num_fix_stat[4] = 0;
  num_enchant_to_a = 0;
  num_enchant_to_d = 0;
  num_enchant_to_h = 0;
  home_slot_free = 0;
  home_damage = 0;
  num_book[0] = 0;
  num_book[1] = 0;
  num_book[2] = 0;
  num_book[3] = 0;
  num_book[4] = 0;
  num_book[5] = 0;
  num_book[6] = 0;
  num_book[7] = 0;
  home_un_id = 0;
  num_duplicate_items = 0;
  if (!no_items) {
    local_38 = borg_shops;
    lVar12 = 0;
    uVar13 = 0;
    while( true ) {
      uVar7 = z_info->store_inven_max;
      if ((ulong)uVar7 + 0xc <= uVar13) break;
      item = (borg_item *)in_item;
      if (in_item == (borg_item_conflict *)0x0) {
        if (uVar13 < (uint)uVar7) {
          item = (borg_item *)((local_38[7].ware)->desc + lVar12);
        }
        else {
          item = (borg_item *)
                 (borg_items + (((uint)z_info->pack_size - (uint)uVar7) + (wchar_t)uVar13));
        }
      }
      if (item->iqty == '\0') {
        uVar10 = 1;
        piVar11 = &home_slot_free;
        if (uVar13 < uVar7) {
LAB_00212c52:
          *piVar11 = *piVar11 + uVar10;
        }
        goto LAB_002130a7;
      }
      if (item->aware != true) goto LAB_002130a7;
      flags = item->flags;
      local_40 = lVar12;
      _Var5 = flag_has_dbg(flags,5,10,"item->flags","OF_SLOW_DIGEST");
      if (_Var5) {
        num_slow_digest = num_slow_digest + (ushort)item->iqty;
      }
      _Var5 = flag_has_dbg(flags,5,0xc,"item->flags","OF_REGEN");
      if (_Var5) {
        num_regenerate = num_regenerate + (ushort)item->iqty;
      }
      _Var5 = flag_has_dbg(flags,5,0xd,"item->flags","OF_TELEPATHY");
      if (_Var5) {
        num_telepathy = num_telepathy + (ushort)item->iqty;
      }
      _Var5 = flag_has_dbg(flags,5,0xe,"item->flags","OF_SEE_INVIS");
      if (_Var5) {
        num_see_inv = num_see_inv + (ushort)item->iqty;
      }
      _Var5 = flag_has_dbg(flags,5,0xb,"item->flags","OF_FEATHER");
      if (_Var5) {
        num_ffall = num_ffall + (ushort)item->iqty;
      }
      _Var5 = flag_has_dbg(flags,5,0xf,"item->flags","OF_FREE_ACT");
      if (_Var5) {
        num_free_act = num_free_act + (ushort)item->iqty;
      }
      _Var5 = flag_has_dbg(flags,5,0x10,"item->flags","OF_HOLD_LIFE");
      if (_Var5) {
        num_hold_life = num_hold_life + (ushort)item->iqty;
      }
      _Var5 = flag_has_dbg(flags,5,8,"item->flags","OF_PROT_CONF");
      if (_Var5) {
        num_resist_conf = num_resist_conf + (ushort)item->iqty;
      }
      _Var5 = flag_has_dbg(flags,5,7,"item->flags","OF_PROT_BLIND");
      if (_Var5) {
        num_resist_blind = num_resist_blind + (ushort)item->iqty;
      }
      sVar9 = item->el_info[2].res_level;
      if (sVar9 == 3) {
        num_immune_fire = num_immune_fire + (ushort)item->iqty;
        num_resist_fire = num_resist_fire + (ushort)item->iqty;
      }
      sVar1 = item->el_info[0].res_level;
      if (sVar1 == 3) {
        num_immune_acid = num_immune_acid + (ushort)item->iqty;
        num_resist_acid = num_resist_acid + (ushort)item->iqty;
      }
      sVar2 = item->el_info[3].res_level;
      if (sVar2 == 3) {
        num_immune_cold = num_immune_cold + (ushort)item->iqty;
        num_resist_cold = num_resist_cold + (ushort)item->iqty;
      }
      sVar3 = item->el_info[1].res_level;
      if (sVar3 == 3) {
        num_immune_elec = num_immune_elec + (ushort)item->iqty;
        num_resist_elec = num_resist_elec + (ushort)item->iqty;
      }
      if (sVar1 == 1) {
        num_resist_acid = num_resist_acid + (ushort)item->iqty;
      }
      if (sVar3 == 1) {
        num_resist_elec = num_resist_elec + (ushort)item->iqty;
      }
      if (sVar9 == 1) {
        num_resist_fire = num_resist_fire + (ushort)item->iqty;
      }
      if (sVar2 == 1) {
        num_resist_cold = num_resist_cold + (ushort)item->iqty;
      }
      if (item->el_info[4].res_level == 1) {
        num_resist_pois = num_resist_pois + (ushort)item->iqty;
      }
      if (item->el_info[7].res_level == 1) {
        num_resist_sound = num_resist_sound + (ushort)item->iqty;
      }
      if (item->el_info[5].res_level == 1) {
        num_resist_LIGHT = num_resist_LIGHT + (ushort)item->iqty;
      }
      if (item->el_info[6].res_level == 1) {
        num_resist_dark = num_resist_dark + (ushort)item->iqty;
      }
      if (item->el_info[0xb].res_level == 1) {
        num_resist_chaos = num_resist_chaos + (ushort)item->iqty;
      }
      if (item->el_info[0xc].res_level == 1) {
        num_resist_disen = num_resist_disen + (ushort)item->iqty;
      }
      if (item->el_info[8].res_level == 1) {
        num_resist_shard = num_resist_shard + (ushort)item->iqty;
      }
      if (item->el_info[9].res_level == 1) {
        num_resist_nexus = num_resist_nexus + (ushort)item->iqty;
      }
      if (item->el_info[10].res_level == 1) {
        num_resist_neth = num_resist_neth + (ushort)item->iqty;
      }
      _Var5 = flag_has_dbg(flags,5,1,"item->flags","OF_SUST_STR");
      if (_Var5) {
        num_sustain_str = num_sustain_str + (ushort)item->iqty;
      }
      _Var5 = flag_has_dbg(flags,5,2,"item->flags","OF_SUST_INT");
      if (_Var5) {
        num_sustain_str = num_sustain_str + (ushort)item->iqty;
      }
      _Var5 = flag_has_dbg(flags,5,3,"item->flags","OF_SUST_WIS");
      if (_Var5) {
        num_sustain_str = num_sustain_str + (ushort)item->iqty;
      }
      _Var5 = flag_has_dbg(flags,5,4,"item->flags","OF_SUST_DEX");
      if (_Var5) {
        num_sustain_str = num_sustain_str + (ushort)item->iqty;
      }
      _Var5 = flag_has_dbg(flags,5,5,"item->flags","OF_SUST_CON");
      if (_Var5) {
        num_sustain_str = num_sustain_str + (ushort)item->iqty;
      }
      _Var5 = flag_has_dbg(flags,5,1,"item->flags","OF_SUST_STR");
      if ((((_Var5) && (_Var5 = flag_has_dbg(flags,5,2,"item->flags","OF_SUST_INT"), _Var5)) &&
          (_Var5 = flag_has_dbg(flags,5,3,"item->flags","OF_SUST_WIS"), _Var5)) &&
         ((_Var5 = flag_has_dbg(flags,5,4,"item->flags","OF_SUST_DEX"), _Var5 &&
          (_Var5 = flag_has_dbg(flags,5,5,"item->flags","OF_SUST_CON"), _Var5)))) {
        num_sustain_all = num_sustain_all + (ushort)item->iqty;
      }
      sVar9 = item->modifiers[0];
      if ((sVar9 != 0) && ((3 < sVar9 || (item->tval != '\x15')))) {
        home_stat_add[0] = home_stat_add[0] + sVar9 * (ushort)item->iqty;
      }
      sVar9 = item->modifiers[1];
      if ((sVar9 != 0) && ((3 < sVar9 || (item->tval != '\x15')))) {
        home_stat_add[1] = home_stat_add[1] + sVar9 * (ushort)item->iqty;
      }
      sVar9 = item->modifiers[2];
      if ((sVar9 != 0) && ((3 < sVar9 || (item->tval != '\x15')))) {
        home_stat_add[2] = home_stat_add[2] + sVar9 * (ushort)item->iqty;
      }
      sVar9 = item->modifiers[3];
      if ((sVar9 != 0) && ((3 < sVar9 || (item->tval != '\x15')))) {
        home_stat_add[3] = home_stat_add[3] + sVar9 * (ushort)item->iqty;
      }
      sVar9 = item->modifiers[4];
      if (sVar9 == 0) {
        bVar6 = item->iqty;
      }
      else {
        bVar6 = item->iqty;
        if ((3 < sVar9) || (item->tval != '\x15')) {
          home_stat_add[4] = home_stat_add[4] + (ushort)bVar6 * sVar9;
        }
      }
      num_speed = num_speed + item->modifiers[9] * (ushort)bVar6;
      if (item->art_idx != '\0') {
        num_artifact = num_artifact + (ushort)bVar6;
      }
      _Var5 = borg_ego_has_random_power(e_info + item->ego_idx);
      if (_Var5) {
        if ((item->needs_ident & 1U) != 0) {
          num_ego = num_ego + (ushort)item->iqty;
LAB_00212cb7:
          if (uVar13 < z_info->store_inven_max) {
            home_un_id = home_un_id + 1;
          }
        }
      }
      else if ((item->needs_ident & 1U) != 0) goto LAB_00212cb7;
      switch(item->tval) {
      case '\x02':
      case '\x03':
      case '\x04':
        if ((borg.trait[0x98] == (uint)item->tval) && (0 < item->value)) {
          num_missile = num_missile + (ushort)item->iqty;
        }
        break;
      case '\x05':
        num_bow = num_bow + (ushort)item->iqty;
        goto LAB_00213085;
      case '\a':
      case '\b':
      case '\t':
        num_weapons = num_weapons + (ushort)item->iqty;
        _Var5 = flag_has_dbg((player->state).pflags,3,3,"player->state.pflags","(PF_BLESS_WEAPON)");
        if (((_Var5) && (item->tval != '\a')) &&
           (_Var5 = flag_has_dbg(flags,5,0x12,"item->flags","OF_BLESSED"), !_Var5)) {
          num_edged_weapon = num_edged_weapon + (ushort)item->iqty;
        }
        wVar8 = borg_calc_blows(item);
        if ((item->to_d < 9) && (0xe < borg.trait[0x23])) {
          sVar9 = (short)borg.trait[0x87] + (ushort)item->ds * (ushort)item->dd + 8;
        }
        else {
          sVar9 = item->to_d + (short)borg.trait[0x87] + (ushort)item->ds * (ushort)item->dd;
        }
        home_damage = home_damage + sVar9 * (short)wVar8;
        goto LAB_00213085;
      case '\n':
        num_boots = num_boots + (ushort)item->iqty;
        goto LAB_00213085;
      case '\v':
        num_gloves = num_gloves + (ushort)item->iqty;
        home_damage = home_damage + item->to_d * 3;
        goto LAB_00213085;
      case '\f':
      case '\r':
        num_hats = num_hats + (ushort)item->iqty;
        goto LAB_00213085;
      case '\x0e':
        num_shields = num_shields + (ushort)item->iqty;
        goto LAB_00213085;
      case '\x0f':
        num_cloaks = num_cloaks + (ushort)item->iqty;
        goto LAB_00213085;
      case '\x10':
      case '\x11':
        num_armor = num_armor + (ushort)item->iqty;
LAB_00213085:
        _Var5 = false;
LAB_0021308a:
        borg_notice_home_dupe((borg_item_conflict *)item,_Var5,(wchar_t)uVar13);
        break;
      case '\x12':
        num_armor = num_armor + (ushort)item->iqty;
        goto LAB_00212feb;
      case '\x13':
        if (sv_light_torch == (uint)borg_items[(ulong)z_info->pack_size + 5].sval) {
          num_fuel = num_fuel + (ushort)item->iqty;
        }
        if (item->art_idx != '\0') {
          num_LIGHT = num_LIGHT + (ushort)item->iqty;
        }
        break;
      case '\x14':
        num_neck = num_neck + (ushort)item->iqty;
        goto LAB_00212feb;
      case '\x15':
        num_rings = num_rings + (ushort)item->iqty;
LAB_00212feb:
        _Var5 = true;
        goto LAB_0021308a;
      case '\x16':
        if (((3 < item->pval) || (borg.trait[0x23] < 0x1f)) &&
           (sv_staff_teleportation == (uint)item->sval)) {
          num_escape = num_escape + item->pval * (ushort)item->iqty;
          num_tele_staves = num_tele_staves + 1;
        }
        break;
      case '\x18':
        if (sv_rod_recall == (uint)item->sval) {
          uVar7 = (ushort)item->iqty * 100;
LAB_0021305c:
          num_recall = num_recall + uVar7;
        }
        break;
      case '\x19':
        bVar6 = item->sval;
        if (sv_scroll_identify == (uint)bVar6) {
          num_ident = num_ident + (ushort)item->iqty;
        }
        else if (sv_scroll_phase_door == (uint)bVar6) {
          num_phase = num_phase + (ushort)item->iqty;
        }
        else {
          wVar8 = (wchar_t)bVar6;
          if (sv_scroll_teleport == wVar8) {
            num_teleport = num_teleport + (ushort)item->iqty;
          }
          else {
            if (sv_scroll_word_of_recall == wVar8) {
              uVar7 = (ushort)item->iqty;
              goto LAB_0021305c;
            }
            if (sv_scroll_enchant_armor == wVar8) {
              num_enchant_to_a = num_enchant_to_a + (ushort)item->iqty;
            }
            else if (sv_scroll_enchant_weapon_to_hit == wVar8) {
              num_enchant_to_h = num_enchant_to_h + (ushort)item->iqty;
            }
            else {
              wVar8 = (wchar_t)bVar6;
              if (sv_scroll_enchant_weapon_to_dam == wVar8) {
                num_enchant_to_d = num_enchant_to_d + (ushort)item->iqty;
              }
              else if (sv_scroll_protection_from_evil == wVar8) {
                num_pfe = num_pfe + (ushort)item->iqty;
              }
              else if (sv_scroll_rune_of_protection == wVar8) {
                num_glyph = num_glyph + (ushort)item->iqty;
              }
              else if (sv_scroll_teleport_level == wVar8) {
                num_teleport_level = num_teleport_level + (ushort)item->iqty;
              }
              else if (sv_scroll_recharging == wVar8) {
                num_recharge = num_recharge + (ushort)item->iqty;
              }
              else if (sv_scroll_mass_banishment == wVar8) {
                num_mass_genocide = num_mass_genocide + (ushort)item->iqty;
              }
            }
          }
        }
        break;
      case '\x1a':
        bVar6 = item->sval;
        if (sv_potion_cure_critical == (uint)bVar6) {
          num_cure_critical = num_cure_critical + (ushort)item->iqty;
        }
        else if (sv_potion_cure_serious == (uint)bVar6) {
          num_cure_serious = num_cure_serious + (ushort)item->iqty;
        }
        else {
          wVar8 = (wchar_t)bVar6;
          if (sv_potion_resist_heat == wVar8) {
            num_pot_rheat = num_pot_rheat + (ushort)item->iqty;
          }
          else if (sv_potion_resist_cold == wVar8) {
            num_pot_rcold = num_pot_rcold + (ushort)item->iqty;
          }
          else if (sv_potion_restore_life == wVar8) {
            num_fix_exp = num_fix_exp + (ushort)item->iqty;
          }
          else {
            if (sv_potion_restore_mana != wVar8) {
              wVar8 = (wchar_t)bVar6;
              if (sv_potion_healing == wVar8) {
                uVar10 = (ushort)item->iqty;
                num_heal = num_heal + uVar10;
                piVar11 = &num_heal_true;
              }
              else {
                if (sv_potion_star_healing == wVar8) {
                  bVar6 = item->iqty;
                  num_ezheal = num_ezheal + (ushort)bVar6;
                  piVar11 = &num_ezheal_true;
                }
                else {
                  if (sv_potion_life != wVar8) {
                    if (sv_potion_berserk == wVar8) {
                      num_berserk = num_berserk + (ushort)item->iqty;
                    }
                    else if (sv_potion_speed == wVar8) {
                      num_speed = num_speed + (ushort)item->iqty;
                    }
                    break;
                  }
                  bVar6 = item->iqty;
                  num_life = num_life + (ushort)bVar6;
                  piVar11 = &num_life_true;
                }
                uVar10 = (ushort)bVar6;
              }
              lVar12 = local_40;
              if (in_item == (borg_item_conflict *)0x0) goto LAB_00212c52;
              goto LAB_002121b9;
            }
            num_mana = num_mana + (ushort)item->iqty;
          }
        }
        break;
      case '\x1b':
        if (sv_light_lantern == (uint)borg_items[(ulong)z_info->pack_size + 5].sval) {
          num_fuel = num_fuel + (ushort)item->iqty;
        }
        break;
      case '\x1c':
        bVar6 = item->sval;
        if (sv_food_ration == (uint)bVar6) {
          num_food = num_food + (ushort)item->iqty;
        }
        else if (sv_food_slime_mold == (uint)bVar6) {
          num_mold = num_mold + (ushort)item->iqty;
        }
        else if (sv_mush_purging == (uint)bVar6) {
          num_fix_stat[4] = num_fix_stat[4] + (ushort)item->iqty;
          num_fix_stat[0] = num_fix_stat[0] + (ushort)item->iqty;
        }
        else if (sv_mush_restoring == (uint)bVar6) {
          bVar6 = item->iqty;
          auVar14 = pshuflw(ZEXT116(bVar6),ZEXT116(bVar6),0);
          num_fix_stat[0] = auVar14._0_2_ + num_fix_stat[0];
          num_fix_stat[1] = auVar14._2_2_ + num_fix_stat[1];
          num_fix_stat[2] = auVar14._4_2_ + num_fix_stat[2];
          num_fix_stat[3] = auVar14._6_2_ + num_fix_stat[3];
          num_fix_stat[4] = num_fix_stat[4] + (ushort)bVar6;
        }
        break;
      case '\x1e':
      case '\x1f':
      case ' ':
      case '!':
      case '\"':
        _Var5 = obj_kind_can_browse(k_info + item->kind);
        if ((_Var5) &&
           (_Var5 = flag_has_dbg(k_info[item->kind].kind_flags,2,7,"k_info[item->kind].kind_flags",
                                 "KF_GOOD"), !_Var5)) {
          num_book[item->sval] = num_book[item->sval] + (ushort)item->iqty;
        }
      }
      lVar12 = local_40;
      if (in_item != (borg_item_conflict *)0x0) break;
LAB_002130a7:
      uVar13 = uVar13 + 1;
      lVar12 = lVar12 + 0x388;
    }
  }
LAB_002121b9:
  _Var5 = borg_spell_legal(REMOVE_HUNGER);
  if ((_Var5) || (_Var5 = borg_spell_legal(HERBAL_CURING), _Var5)) {
    num_food = num_food + 1000;
  }
  _Var5 = borg_spell_legal(IDENTIFY_RUNE);
  if (_Var5) {
    num_ident = num_ident + 1000;
  }
  _Var5 = borg_spell_legal_fail(ENCHANT_WEAPON,L'A');
  if (_Var5) {
    num_enchant_to_h = num_enchant_to_h + 1000;
    num_enchant_to_d = num_enchant_to_d + 1000;
  }
  _Var5 = borg_spell_legal(PROTECTION_FROM_EVIL);
  if (_Var5) {
    num_pfe = num_pfe + 1000;
  }
  _Var5 = borg_spell_legal(GLYPH_OF_WARDING);
  if ((_Var5) || (_Var5 = borg_equips_item(act_glyph,false), _Var5)) {
    num_glyph = num_glyph + 1000;
  }
  _Var5 = borg_spell_legal(WORD_OF_RECALL);
  if (_Var5) {
    num_recall = num_recall + 1000;
  }
  _Var5 = borg_spell_legal(TELEPORT_LEVEL);
  if (_Var5) {
    num_teleport_level = num_teleport_level + 1000;
  }
  _Var5 = borg_spell_legal(RECHARGING);
  if (_Var5) {
    num_recharge = num_recharge + 1000;
  }
  if (borg.trait[0x14] != 0) {
    num_fix_stat[0] = num_fix_stat[0] + 1000;
  }
  if (borg.trait[0x15] != 0) {
    num_fix_stat[1] = num_fix_stat[1] + 1000;
  }
  if (borg.trait[0x16] != 0) {
    num_fix_stat[2] = num_fix_stat[2] + 1000;
  }
  if (borg.trait[0x17] != 0) {
    num_fix_stat[3] = num_fix_stat[3] + 1000;
  }
  if (borg.trait[0x18] != 0) {
    num_fix_stat[4] = num_fix_stat[4] + 1000;
  }
  player_flags(player,local_45);
  _Var5 = flag_has_dbg(local_45,5,10,"f","OF_SLOW_DIGEST");
  if (_Var5) {
    num_slow_digest = num_slow_digest + 1;
  }
  _Var5 = flag_has_dbg(local_45,5,0xb,"f","OF_FEATHER");
  if (_Var5) {
    num_ffall = num_ffall + 1;
  }
  _Var5 = flag_has_dbg(local_45,5,0x1e,"f","OF_LIGHT_2");
  if ((_Var5) || (_Var5 = flag_has_dbg(local_45,0xb,0x1f,"f","OF_LIGHT_3"), _Var5)) {
    num_LIGHT = num_LIGHT + 1;
  }
  _Var5 = flag_has_dbg(local_45,5,0xc,"f","OF_REGEN");
  if (_Var5) {
    num_regenerate = num_regenerate + 1;
  }
  _Var5 = flag_has_dbg(local_45,5,0xd,"f","OF_TELEPATHY");
  if (_Var5) {
    num_telepathy = num_telepathy + 1;
  }
  _Var5 = flag_has_dbg(local_45,5,0xe,"f","OF_SEE_INVIS");
  if (_Var5) {
    num_see_inv = num_see_inv + 1;
  }
  _Var5 = flag_has_dbg(local_45,5,0xf,"f","OF_FREE_ACT");
  if (_Var5) {
    num_free_act = num_free_act + 1;
  }
  _Var5 = flag_has_dbg(local_45,5,0x10,"f","OF_HOLD_LIFE");
  if (_Var5) {
    num_hold_life = num_hold_life + 1;
  }
  _Var5 = flag_has_dbg(local_45,5,8,"f","OF_PROT_CONF");
  if (_Var5) {
    num_resist_conf = num_resist_conf + 1;
  }
  _Var5 = flag_has_dbg(local_45,5,7,"f","OF_PROT_BLIND");
  if (_Var5) {
    num_resist_blind = num_resist_blind + 1;
  }
  ppVar4 = player->race;
  sVar9 = ppVar4->el_info[2].res_level;
  if (sVar9 == 3) {
    num_immune_fire = num_immune_fire + 1;
  }
  sVar1 = ppVar4->el_info[0].res_level;
  if (sVar1 == 3) {
    num_immune_acid = num_immune_acid + 1;
  }
  sVar2 = ppVar4->el_info[3].res_level;
  if (sVar2 == 3) {
    num_immune_cold = num_immune_cold + 1;
  }
  sVar3 = ppVar4->el_info[1].res_level;
  if (sVar3 == 3) {
    num_immune_elec = num_immune_elec + 1;
  }
  if (0 < sVar1) {
    num_resist_acid = num_resist_acid + 1;
  }
  if (0 < sVar3) {
    num_resist_elec = num_resist_elec + 1;
  }
  if (0 < sVar9) {
    num_resist_fire = num_resist_fire + 1;
  }
  if (0 < sVar2) {
    num_resist_cold = num_resist_cold + 1;
  }
  if (0 < ppVar4->el_info[4].res_level) {
    num_resist_pois = num_resist_pois + 1;
  }
  if (0 < ppVar4->el_info[5].res_level) {
    num_resist_LIGHT = num_resist_LIGHT + 1;
  }
  if (0 < ppVar4->el_info[6].res_level) {
    num_resist_dark = num_resist_dark + 1;
  }
  if (0 < ppVar4->el_info[7].res_level) {
    num_resist_sound = num_resist_sound + 1;
  }
  if (0 < ppVar4->el_info[8].res_level) {
    num_resist_shard = num_resist_shard + 1;
  }
  if (0 < ppVar4->el_info[9].res_level) {
    num_resist_nexus = num_resist_nexus + 1;
  }
  if (0 < ppVar4->el_info[10].res_level) {
    num_resist_neth = num_resist_neth + 1;
  }
  if (0 < ppVar4->el_info[0xb].res_level) {
    num_resist_chaos = num_resist_chaos + 1;
  }
  if (0 < ppVar4->el_info[0xc].res_level) {
    num_resist_disen = num_resist_disen + 1;
  }
  _Var5 = flag_has_dbg(local_45,0xb,1,"f","OF_SUST_STR");
  if (_Var5) {
    num_sustain_str = num_sustain_str + 1;
  }
  _Var5 = flag_has_dbg(local_45,0xb,2,"f","OF_SUST_INT");
  if (_Var5) {
    num_sustain_int = num_sustain_int + 1;
  }
  _Var5 = flag_has_dbg(local_45,0xb,3,"f","OF_SUST_WIS");
  if (_Var5) {
    num_sustain_wis = num_sustain_wis + 1;
  }
  _Var5 = flag_has_dbg(local_45,0xb,4,"f","OF_SUST_DEX");
  if (_Var5) {
    num_sustain_dex = num_sustain_dex + 1;
  }
  _Var5 = flag_has_dbg(local_45,0xb,5,"f","OF_SUST_CON");
  if (_Var5) {
    num_sustain_con = num_sustain_con + 1;
  }
  return;
}

Assistant:

static void borg_notice_home_clear(borg_item *in_item, bool no_items)
{

    /*** Reset counters ***/

    /* Reset basic */
    num_food                = 0;
    num_fuel                = 0;
    num_mold                = 0;
    num_ident               = 0;
    num_recall              = 0;
    num_phase               = 0;
    num_escape              = 0;
    num_tele_staves         = 0;
    num_teleport            = 0;
    num_teleport_level      = 0;
    num_recharge            = 0;

    num_artifact            = 0;
    num_ego                 = 0;

    num_invisible           = 0;
    num_pfe                 = 0;
    num_glyph               = 0;
    num_genocide            = 0;
    num_mass_genocide       = 0;
    num_berserk             = 0;
    num_pot_rheat           = 0;
    num_pot_rcold           = 0;
    num_speed               = 0;

    num_slow_digest         = 0;
    num_regenerate          = 0;
    num_telepathy           = 0;
    num_see_inv             = 0;
    num_ffall               = 0;
    num_free_act            = 0;
    num_hold_life           = 0;
    num_immune_acid         = 0;
    num_immune_elec         = 0;
    num_immune_fire         = 0;
    num_immune_cold         = 0;
    num_resist_acid         = 0;
    num_resist_elec         = 0;
    num_resist_fire         = 0;
    num_resist_cold         = 0;
    num_resist_pois         = 0;
    num_resist_conf         = 0;
    num_resist_sound        = 0;
    num_resist_LIGHT        = 0;
    num_resist_dark         = 0;
    num_resist_chaos        = 0;
    num_resist_disen        = 0;
    num_resist_shard        = 0;
    num_resist_nexus        = 0;
    num_resist_blind        = 0;
    num_resist_neth         = 0;
    num_sustain_str         = 0;
    num_sustain_int         = 0;
    num_sustain_wis         = 0;
    num_sustain_dex         = 0;
    num_sustain_con         = 0;
    num_sustain_all         = 0;

    home_stat_add[STAT_STR] = 0;
    home_stat_add[STAT_INT] = 0;
    home_stat_add[STAT_WIS] = 0;
    home_stat_add[STAT_DEX] = 0;
    home_stat_add[STAT_CON] = 0;

    num_weapons             = 0;

    num_bow                 = 0;
    num_rings               = 0;
    num_neck                = 0;
    num_armor               = 0;
    num_cloaks              = 0;
    num_shields             = 0;
    num_hats                = 0;
    num_gloves              = 0;
    num_boots               = 0;
    num_LIGHT               = 0;
    num_speed               = 0;
    num_edged_weapon        = 0;
    num_bad_gloves          = 0;

    /* Reset healing */
    num_cure_critical = 0;
    num_cure_serious  = 0;
    num_fix_exp       = 0;
    num_mana          = 0;
    num_heal          = 0;
    num_ezheal        = 0;
    num_life          = 0;
    if (!in_item && !no_items)
        num_ezheal_true = 0;
    if (!in_item && !no_items)
        num_heal_true = 0;
    if (!in_item && !no_items)
        num_life_true = 0;

    /* Reset missiles */
    num_missile = 0;

    /* Reset books */
    num_book[0] = 0;
    num_book[1] = 0;
    num_book[2] = 0;
    num_book[3] = 0;
    num_book[4] = 0;
    num_book[5] = 0;
    num_book[6] = 0;
    num_book[7] = 0;
    num_book[8] = 0;

    /* Reset various */
    num_fix_stat[STAT_STR] = 0;
    num_fix_stat[STAT_INT] = 0;
    num_fix_stat[STAT_WIS] = 0;
    num_fix_stat[STAT_DEX] = 0;
    num_fix_stat[STAT_CON] = 0;

    /* Reset enchantment */
    num_enchant_to_a    = 0;
    num_enchant_to_d    = 0;
    num_enchant_to_h    = 0;

    home_slot_free      = 0;
    home_damage         = 0;
    home_un_id          = 0;

    num_duplicate_items = 0;
}